

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O2

bool BlockDevice::IsFileHDD(string *path)

{
  bool bVar1;
  int64_t iVar2;
  ulong uVar3;
  
  bVar1 = IsFile(path);
  if ((bVar1) && (iVar2 = FileSize(path), 0x10000000 < iVar2)) {
    uVar3 = FileSize(path);
    return (uVar3 & 0x1ff) == 0;
  }
  return false;
}

Assistant:

bool BlockDevice::IsFileHDD(const std::string& path)
{
    if (!IsFile(path))
        return false;

    // Reject files under max image size, and those not an exact sector multiple
    if (FileSize(path) <= MAX_IMAGE_SIZE || (FileSize(path) & (SECTOR_SIZE - 1)))
        return false;

    // Appears valid
    return true;
}